

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  NamePattern *this_local;
  
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__NamePattern_0022cca8;
  WildcardPattern::~WildcardPattern(&this->m_wildcardPattern);
  Pattern::~Pattern(&this->super_Pattern);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}